

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringSliceWTF
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          StringSliceWTF *curr)

{
  pointer pLVar1;
  Literal *pLVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined1 auVar5 [8];
  ulong uVar6;
  long lVar7;
  shared_ptr<wasm::GCData> sVar8;
  undefined1 local_180 [8];
  Flow ref;
  Flow start;
  Flow end;
  Literals contents;
  undefined1 local_48 [8];
  shared_ptr<wasm::GCData> refData;
  
  visit((Flow *)local_180,this,curr->ref);
  if (ref.breakTo.super_IString.str._M_len == 0) {
    refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    visit((Flow *)&ref.breakTo.super_IString.str._M_str,this,curr->start);
    if (start.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)&start.breakTo.super_IString.str._M_str,
            (ExpressionRunner<wasm::ModuleRunner> *)
            refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
            curr->end);
      if (end.breakTo.super_IString.str._M_len == 0) {
        Flow::getSingleValue((Flow *)local_180);
        sVar8 = Literal::getGCData((Literal *)local_48);
        auVar5 = local_48;
        if (local_48 == (undefined1  [8])0x0) {
          (*(refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_vptr__Sp_counted_base[2])
                    (refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi,"null ref",
                     sVar8.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi._M_pi);
          auVar5 = local_48;
        }
        pLVar2 = Flow::getSingleValue((Flow *)&ref.breakTo.super_IString.str._M_str);
        uVar3 = Literal::getUnsigned(pLVar2);
        pLVar2 = Flow::getSingleValue((Flow *)&start.breakTo.super_IString.str._M_str);
        uVar4 = Literal::getUnsigned(pLVar2);
        uVar6 = ((long)(((element_type *)auVar5)->values).super_SmallVector<wasm::Literal,_1UL>.
                       flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(((element_type *)auVar5)->values).super_SmallVector<wasm::Literal,_1UL>.
                      flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x18 +
                (((element_type *)auVar5)->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed;
        if (uVar4 <= uVar6) {
          uVar6 = uVar4;
        }
        contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
        contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
        contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
        str._M_str = (char *)0x0;
        end.breakTo.super_IString.str._M_str = (char *)0x0;
        contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        if (uVar3 <= uVar6 && uVar6 - uVar3 != 0) {
          SmallVector<wasm::Literal,_1UL>::reserve
                    ((SmallVector<wasm::Literal,_1UL> *)&end.breakTo.super_IString.str._M_str,
                     uVar6 - uVar3);
          lVar7 = uVar3 * 0x18 + -0x18;
          for (; uVar3 < uVar6; uVar3 = uVar3 + 1) {
            pLVar1 = (((element_type *)auVar5)->values).super_SmallVector<wasm::Literal,_1UL>.
                     flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (uVar3 < ((long)(((element_type *)auVar5)->values).
                               super_SmallVector<wasm::Literal,_1UL>.flexible.
                               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pLVar1) / 0x18 +
                        (((element_type *)auVar5)->values).super_SmallVector<wasm::Literal,_1UL>.
                        usedFixed) {
              pLVar2 = (Literal *)((long)&pLVar1->field_0 + lVar7);
              if (uVar3 == 0) {
                pLVar2 = (((element_type *)auVar5)->values).super_SmallVector<wasm::Literal,_1UL>.
                         fixed._M_elems;
              }
              SmallVector<wasm::Literal,_1UL>::push_back
                        ((SmallVector<wasm::Literal,_1UL> *)&end.breakTo.super_IString.str._M_str,
                         pLVar2);
            }
            lVar7 = lVar7 + 0x18;
          }
        }
        makeGCData((Literal *)
                   &contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (ExpressionRunner<wasm::ModuleRunner> *)
                   refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi,(Literals *)&end.breakTo.super_IString.str._M_str,
                   (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)89>).super_Expression
                         .type.id);
        Flow::Flow(__return_storage_ptr__,
                   (Literal *)
                   &contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        Literal::~Literal((Literal *)
                          &contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)&end.breakTo.super_IString.str._M_str);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&refData);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&start.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&start.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&ref.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_180);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_180);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringSliceWTF(StringSliceWTF* curr) {
    Flow ref = visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow start = visit(curr->start);
    if (start.breaking()) {
      return start;
    }
    Flow end = visit(curr->end);
    if (end.breaking()) {
      return end;
    }

    auto refData = ref.getSingleValue().getGCData();
    if (!refData) {
      trap("null ref");
    }
    auto& refValues = refData->values;
    auto startVal = start.getSingleValue().getUnsigned();
    auto endVal = end.getSingleValue().getUnsigned();
    endVal = std::min<size_t>(endVal, refValues.size());

    Literals contents;
    if (endVal > startVal) {
      contents.reserve(endVal - startVal);
      for (size_t i = startVal; i < endVal; i++) {
        if (i < refValues.size()) {
          contents.push_back(refValues[i]);
        }
      }
    }
    return makeGCData(std::move(contents), curr->type);
  }